

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_ecdsa_recover
              (secp256k1_context *ctx,secp256k1_pubkey *pubkey,
              secp256k1_ecdsa_recoverable_signature *signature,uchar *msghash32)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  undefined4 extraout_EAX;
  int iVar4;
  uint uVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  secp256k1_scalar r;
  secp256k1_scalar s;
  secp256k1_ge x;
  secp256k1_scalar m;
  uchar brx [32];
  secp256k1_scalar u2;
  secp256k1_scalar u1;
  secp256k1_scalar rn;
  secp256k1_ge q;
  secp256k1_gej xj;
  secp256k1_gej qj;
  secp256k1_fe local_308;
  secp256k1_scalar local_2d8;
  secp256k1_scalar local_2b8;
  secp256k1_ge local_290;
  secp256k1_scalar local_238;
  uchar local_218 [40];
  secp256k1_scalar local_1f0;
  secp256k1_scalar local_1d0;
  secp256k1_scalar local_1b0;
  secp256k1_ge local_190;
  undefined1 local_138 [104];
  undefined1 local_d0 [16];
  int local_c0;
  secp256k1_gej local_b0;
  
  if (msghash32 == (uchar *)0x0) {
    secp256k1_ecdsa_recover_cold_3();
  }
  else if (signature == (secp256k1_ecdsa_recoverable_signature *)0x0) {
    secp256k1_ecdsa_recover_cold_2();
  }
  else if (pubkey == (secp256k1_pubkey *)0x0) {
    secp256k1_ecdsa_recover_cold_1();
  }
  else {
    local_2d8.d[0] = *(uint64_t *)signature->data;
    local_2d8.d[1] = *(uint64_t *)(signature->data + 8);
    local_2d8.d[2] = *(uint64_t *)(signature->data + 0x10);
    local_2d8.d[3] = *(uint64_t *)(signature->data + 0x18);
    local_2b8.d[0] = *(uint64_t *)(signature->data + 0x20);
    local_2b8.d[1] = *(uint64_t *)(signature->data + 0x28);
    local_2b8.d[2] = *(uint64_t *)(signature->data + 0x30);
    local_2b8.d[3] = *(uint64_t *)(signature->data + 0x38);
    bVar1 = signature->data[0x40];
    secp256k1_scalar_set_b32(&local_238,msghash32,(int *)0x0);
    auVar7._0_4_ = -(uint)((int)local_2d8.d[0] == 0 && (int)local_2d8.d[2] == 0);
    auVar7._4_4_ = -(uint)(local_2d8.d[0]._4_4_ == 0 && local_2d8.d[2]._4_4_ == 0);
    auVar7._8_4_ = -(uint)((int)local_2d8.d[1] == 0 && (int)local_2d8.d[3] == 0);
    auVar7._12_4_ = -(uint)(local_2d8.d[1]._4_4_ == 0 && local_2d8.d[3]._4_4_ == 0);
    iVar4 = movmskps(extraout_EAX,auVar7);
    if ((iVar4 != 0xf) &&
       ((local_2b8.d[1] != 0 || local_2b8.d[3] != 0) || (local_2b8.d[0] != 0 || local_2b8.d[2] != 0)
       )) {
      secp256k1_scalar_get_b32(local_218,&local_2d8);
      secp256k1_fe_impl_set_b32_mod(&local_308,local_218);
      if ((bVar1 & 2) == 0) {
LAB_0046651e:
        iVar4 = secp256k1_ge_set_xo_var(&local_290,&local_308,bVar1 & 1);
        if (iVar4 != 0) {
          local_c0 = local_290.infinity;
          local_138._0_8_ = local_290.x.n[0];
          local_138._8_8_ = local_290.x.n[1];
          local_138._16_8_ = local_290.x.n[2];
          local_138._24_8_ = local_290.x.n[3];
          local_138._32_8_ = local_290.x.n[4];
          local_138._40_8_ = local_290.y.n[0];
          local_138._48_8_ = local_290.y.n[1];
          local_138._56_8_ = local_290.y.n[2];
          local_138._64_8_ = local_290.y.n[3];
          local_138._72_8_ = local_290.y.n[4];
          local_138._80_8_ = 1;
          local_138._88_16_ = (undefined1  [16])0x0;
          local_d0 = (undefined1  [16])0x0;
          secp256k1_scalar_inverse_var(&local_1b0,&local_2d8);
          secp256k1_scalar_mul(&local_1d0,&local_1b0,&local_238);
          secp256k1_scalar_negate(&local_1d0,&local_1d0);
          secp256k1_scalar_mul(&local_1f0,&local_1b0,&local_2b8);
          secp256k1_ecmult(&local_b0,(secp256k1_gej *)local_138,&local_1f0,&local_1d0);
          secp256k1_ge_set_gej_var(&local_190,&local_b0);
          if (local_b0.infinity == 0) {
            secp256k1_pubkey_save(pubkey,&local_190);
            return 1;
          }
        }
      }
      else {
        uVar5 = 4;
        do {
          uVar2 = secp256k1_ecdsa_const_p_minus_order.n[uVar5];
          uVar3 = local_308.n[uVar5];
          if (uVar3 >= uVar2 && uVar3 != uVar2) break;
          if (uVar3 < uVar2) {
            local_308.n[0] = local_308.n[0] + 0x25e8cd0364141;
            local_308.n[1] = local_308.n[1] + 0xe6af48a03bbfd;
            local_308.n[2] = local_308.n[2] + 0xffffffebaaedc;
            local_308.n[3] = local_308.n[3] + 0xfffffffffffff;
            local_308.n[4] = local_308.n[4] + 0xffffffffffff;
            goto LAB_0046651e;
          }
          bVar6 = uVar5 != 0;
          uVar5 = uVar5 - 1;
        } while (bVar6);
      }
    }
    pubkey->data[0x30] = '\0';
    pubkey->data[0x31] = '\0';
    pubkey->data[0x32] = '\0';
    pubkey->data[0x33] = '\0';
    pubkey->data[0x34] = '\0';
    pubkey->data[0x35] = '\0';
    pubkey->data[0x36] = '\0';
    pubkey->data[0x37] = '\0';
    pubkey->data[0x38] = '\0';
    pubkey->data[0x39] = '\0';
    pubkey->data[0x3a] = '\0';
    pubkey->data[0x3b] = '\0';
    pubkey->data[0x3c] = '\0';
    pubkey->data[0x3d] = '\0';
    pubkey->data[0x3e] = '\0';
    pubkey->data[0x3f] = '\0';
    pubkey->data[0x20] = '\0';
    pubkey->data[0x21] = '\0';
    pubkey->data[0x22] = '\0';
    pubkey->data[0x23] = '\0';
    pubkey->data[0x24] = '\0';
    pubkey->data[0x25] = '\0';
    pubkey->data[0x26] = '\0';
    pubkey->data[0x27] = '\0';
    pubkey->data[0x28] = '\0';
    pubkey->data[0x29] = '\0';
    pubkey->data[0x2a] = '\0';
    pubkey->data[0x2b] = '\0';
    pubkey->data[0x2c] = '\0';
    pubkey->data[0x2d] = '\0';
    pubkey->data[0x2e] = '\0';
    pubkey->data[0x2f] = '\0';
    pubkey->data[0x10] = '\0';
    pubkey->data[0x11] = '\0';
    pubkey->data[0x12] = '\0';
    pubkey->data[0x13] = '\0';
    pubkey->data[0x14] = '\0';
    pubkey->data[0x15] = '\0';
    pubkey->data[0x16] = '\0';
    pubkey->data[0x17] = '\0';
    pubkey->data[0x18] = '\0';
    pubkey->data[0x19] = '\0';
    pubkey->data[0x1a] = '\0';
    pubkey->data[0x1b] = '\0';
    pubkey->data[0x1c] = '\0';
    pubkey->data[0x1d] = '\0';
    pubkey->data[0x1e] = '\0';
    pubkey->data[0x1f] = '\0';
    pubkey->data[0] = '\0';
    pubkey->data[1] = '\0';
    pubkey->data[2] = '\0';
    pubkey->data[3] = '\0';
    pubkey->data[4] = '\0';
    pubkey->data[5] = '\0';
    pubkey->data[6] = '\0';
    pubkey->data[7] = '\0';
    pubkey->data[8] = '\0';
    pubkey->data[9] = '\0';
    pubkey->data[10] = '\0';
    pubkey->data[0xb] = '\0';
    pubkey->data[0xc] = '\0';
    pubkey->data[0xd] = '\0';
    pubkey->data[0xe] = '\0';
    pubkey->data[0xf] = '\0';
  }
  return 0;
}

Assistant:

int secp256k1_ecdsa_recover(const secp256k1_context* ctx, secp256k1_pubkey *pubkey, const secp256k1_ecdsa_recoverable_signature *signature, const unsigned char *msghash32) {
    secp256k1_ge q;
    secp256k1_scalar r, s;
    secp256k1_scalar m;
    int recid;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(msghash32 != NULL);
    ARG_CHECK(signature != NULL);
    ARG_CHECK(pubkey != NULL);

    secp256k1_ecdsa_recoverable_signature_load(ctx, &r, &s, &recid, signature);
    VERIFY_CHECK(recid >= 0 && recid < 4);  /* should have been caught in parse_compact */
    secp256k1_scalar_set_b32(&m, msghash32, NULL);
    if (secp256k1_ecdsa_sig_recover(&r, &s, &q, &m, recid)) {
        secp256k1_pubkey_save(pubkey, &q);
        return 1;
    } else {
        memset(pubkey, 0, sizeof(*pubkey));
        return 0;
    }
}